

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O3

fft_plan *
fft_plan_dft_c2r_1d(fft_plan *__return_storage_ptr__,int n,fft_complex *in,double *out,uint flags)

{
  double *pdVar1;
  int *ip;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = n * 5 + 3;
  if (-1 < n * 5) {
    iVar4 = n * 5;
  }
  uVar5 = (long)(iVar4 >> 2) << 3;
  if (n < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  uVar3 = (long)n * 4;
  if (n < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  uVar2 = (long)n << 3;
  *(undefined8 *)&__return_storage_ptr__->flags = 0;
  __return_storage_ptr__->n = n;
  __return_storage_ptr__->in = (double *)0x0;
  __return_storage_ptr__->c_out = (fft_complex *)0x0;
  __return_storage_ptr__->c_in = in;
  __return_storage_ptr__->out = out;
  __return_storage_ptr__->sign = 2;
  __return_storage_ptr__->flags = flags;
  if (n < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar1 = (double *)operator_new__(uVar2);
  __return_storage_ptr__->input = pdVar1;
  ip = (int *)operator_new__(uVar3);
  __return_storage_ptr__->ip = ip;
  pdVar1 = (double *)operator_new__(uVar5);
  __return_storage_ptr__->w = pdVar1;
  *ip = 0;
  iVar4 = n >> 2;
  makewt(iVar4,ip,pdVar1);
  makect(iVar4,ip,pdVar1 + iVar4);
  return __return_storage_ptr__;
}

Assistant:

fft_plan fft_plan_dft_c2r_1d(int n, fft_complex *in, double *out,
    unsigned int flags) {
  void makewt(int nw, int *ip, double *w);
  void makect(int nc, int *ip, double *c);

  fft_plan output = {0};
  output.n = n;
  output.in = NULL;
  output.c_in = in;
  output.out = out;
  output.c_out = NULL;
  output.sign = FFT_BACKWARD;
  output.flags = flags;
  output.input = new double[n];
  output.ip = new int[n];
  output.w = new double[n * 5 / 4];

  output.ip[0] = 0;
  makewt(output.n >> 2, output.ip, output.w);
  makect(output.n >> 2, output.ip, output.w + (output.n >> 2));
  return output;
}